

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::unclipped_blit
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,uint src_x,uint src_y,uint src_w,
          uint src_h,uint dst_x,uint dst_y,image<crnlib::color_quad<unsigned_char,_int>_> *src)

{
  bool bVar1;
  uint uVar2;
  int in_ECX;
  uint in_EDX;
  uint in_ESI;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  int in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_00000010;
  uint i;
  uint bytes_to_copy;
  color_quad<unsigned_char,_int> *pD;
  color_quad<unsigned_char,_int> *pS;
  int local_40;
  color_quad<unsigned_char,_int> *local_38;
  color_quad<unsigned_char,_int> *local_30;
  bool local_1;
  
  bVar1 = is_valid(in_RDI);
  if ((bVar1) && (bVar1 = is_valid(in_stack_00000010), bVar1)) {
    uVar2 = get_width(in_stack_00000010);
    if ((uVar2 < in_ESI + in_ECX) ||
       (uVar2 = get_height(in_stack_00000010), uVar2 < in_EDX + in_R8D)) {
      local_1 = false;
    }
    else {
      uVar2 = get_width(in_RDI);
      if ((uVar2 < in_R9D + in_ECX) ||
         (uVar2 = get_height(in_RDI), uVar2 < in_stack_00000008 + in_R8D)) {
        local_1 = false;
      }
      else {
        local_30 = operator()(in_stack_00000010,in_ESI,in_EDX);
        local_38 = operator()(in_RDI,in_R9D,in_stack_00000008);
        for (local_40 = in_R8D; local_40 != 0; local_40 = local_40 + -1) {
          memcpy(local_38,local_30,(ulong)(uint)(in_ECX << 2));
          uVar2 = get_pitch(in_stack_00000010);
          local_30 = local_30 + uVar2;
          uVar2 = get_pitch(in_RDI);
          local_38 = local_38 + uVar2;
        }
        local_1 = true;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool unclipped_blit(uint src_x, uint src_y, uint src_w, uint src_h, uint dst_x, uint dst_y, const image& src) {
    if ((!is_valid()) || (!src.is_valid())) {
      CRNLIB_ASSERT(0);
      return false;
    }

    if (((src_x + src_w) > src.get_width()) || ((src_y + src_h) > src.get_height())) {
      CRNLIB_ASSERT(0);
      return false;
    }

    if (((dst_x + src_w) > get_width()) || ((dst_y + src_h) > get_height())) {
      CRNLIB_ASSERT(0);
      return false;
    }

    const color_type* pS = &src(src_x, src_y);
    color_type* pD = &(*this)(dst_x, dst_y);

    const uint bytes_to_copy = src_w * sizeof(color_type);
    for (uint i = src_h; i; i--) {
      memcpy(pD, pS, bytes_to_copy);

      pS += src.get_pitch();
      pD += get_pitch();
    }

    return true;
  }